

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitset.hpp
# Opt level: O0

bool __thiscall
boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this)

{
  bool bVar1;
  block_width_type bVar2;
  size_type sVar3;
  const_reference pvVar4;
  unsigned_long *puVar5;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  block_type mask;
  size_type e_1;
  size_type i_1;
  size_type e;
  size_type i;
  block_type all_ones;
  block_width_type extra_bits;
  ulong local_38;
  ulong local_28;
  
  bVar1 = empty((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cbd98);
  if (!bVar1) {
    bVar2 = count_extra_bits((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                             0x1cbdb2);
    if (bVar2 == 0) {
      local_28 = 0;
      sVar3 = num_blocks((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cbddb);
      for (; local_28 < sVar3; local_28 = local_28 + 1) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&in_RDI->m_bits,local_28);
        if (*pvVar4 != 0xffffffffffffffff) {
          return false;
        }
      }
    }
    else {
      local_38 = 0;
      sVar3 = num_blocks((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)0x1cbe35);
      for (; local_38 < sVar3 - 1; local_38 = local_38 + 1) {
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&in_RDI->m_bits,local_38);
        if (*pvVar4 != 0xffffffffffffffff) {
          return false;
        }
      }
      puVar5 = m_highest_block(in_RDI);
      if (*puVar5 != (-1L << ((byte)bVar2 & 0x3f) ^ 0xffffffffffffffffU)) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool dynamic_bitset<Block, Allocator>::all() const
{
    if (empty()) {
        return true;
    }

    const block_width_type extra_bits = count_extra_bits();
    block_type const all_ones = ~static_cast<Block>(0);

    if (extra_bits == 0) {
        for (size_type i = 0, e = num_blocks(); i < e; ++i) {
            if (m_bits[i] != all_ones) {
                return false;
            }
        }
    } else {
        for (size_type i = 0, e = num_blocks() - 1; i < e; ++i) {
            if (m_bits[i] != all_ones) {
                return false;
            }
        }
        block_type const mask = ~(~static_cast<Block>(0) << extra_bits);
        if (m_highest_block() != mask) {
            return false;
        }
    }
    return true;
}